

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_status_codec.cpp
# Opt level: O0

SubscriptionStatus bidfx_public_api::provider::SubscriptionStatusCodec::DecodeStatus(uchar encoding)

{
  SubscriptionStatus local_c;
  uchar encoding_local;
  
  switch(encoding) {
  case 'C':
    local_c = CANCELLED;
    break;
  case 'D':
    local_c = DISCONTINUED;
    break;
  case 'E':
    local_c = EXHAUSTED;
    break;
  default:
    local_c = PENDING;
    break;
  case 'H':
    local_c = PROHIBITED;
    break;
  case 'I':
    local_c = INACTIVE;
    break;
  case 'L':
    local_c = CLOSED;
    break;
  case 'O':
    local_c = OK;
    break;
  case 'P':
    local_c = PENDING;
    break;
  case 'R':
    local_c = REJECTED;
    break;
  case 'S':
    local_c = STALE;
    break;
  case 'T':
    local_c = TIMEOUT;
    break;
  case 'U':
    local_c = UNAVAILABLE;
  }
  return local_c;
}

Assistant:

SubscriptionStatus SubscriptionStatusCodec::DecodeStatus(unsigned char encoding)
{
    switch (encoding)
    {
        case 'C':
            return SubscriptionStatus::CANCELLED;
        case 'D':
            return SubscriptionStatus::DISCONTINUED;
        case 'E':
            return SubscriptionStatus::EXHAUSTED;
        case 'H':
            return SubscriptionStatus::PROHIBITED;
        case 'I':
            return SubscriptionStatus::INACTIVE;
        case 'L':
            return SubscriptionStatus::CLOSED;
        case 'O':
            return SubscriptionStatus::OK;
        case 'P':
            return SubscriptionStatus::PENDING;
        case 'R':
            return SubscriptionStatus::REJECTED;
        case 'S':
            return SubscriptionStatus::STALE;
        case 'T':
            return SubscriptionStatus::TIMEOUT;
        case 'U':
            return SubscriptionStatus::UNAVAILABLE;
        default:
            return SubscriptionStatus::PENDING;
    }
}